

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O3

QString * __thiscall
ProjectGenerator::getWritableVar
          (QString *__return_storage_ptr__,ProjectGenerator *this,char *vk,bool param_2)

{
  Data *pDVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  qsizetype qVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  QList<ProString> *this_00;
  iterator this_01;
  iterator iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  ProKey v;
  QStringBuilder<const_char_(&)[4],_QString_&> local_128;
  ProString local_118;
  QStringBuilder<ProString,_const_char_(&)[5]> local_e8;
  QString local_a8;
  undefined1 local_88 [32];
  undefined1 local_68 [28];
  int iStack_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)local_68,vk);
  this_00 = &QMakeEvaluator::valuesRef
                       (&((this->super_MakefileGenerator).project)->super_QMakeEvaluator,
                        (ProKey *)local_68)->super_QList<ProString>;
  if ((this_00->d).size == 0) {
    QVar10.m_data = (storage_type *)0x0;
    QVar10.m_size = (qsizetype)&local_e8;
    QString::fromUtf8(QVar10);
    (__return_storage_ptr__->d).d = local_e8.a.m_string.d.d;
    (__return_storage_ptr__->d).ptr = local_e8.a.m_string.d.ptr;
    (__return_storage_ptr__->d).size = local_e8.a.m_string.d.size;
    goto LAB_001a3144;
  }
  this_01 = QList<ProString>::begin(this_00);
  iVar8 = QList<ProString>::end(this_00);
  if (this_01.i != iVar8.i) {
    do {
      iVar7 = ProString::indexOf(this_01.i,(QChar)0x20,0,CaseSensitive);
      if (-1 < iVar7) {
        bVar6 = ProString::startsWith(this_01.i,(QChar)0x20,CaseSensitive);
        if (!bVar6) {
          local_e8.a.m_string.d.d = (Data *)0x2b5765;
          local_e8.a.m_string.d.size = 0x2b5765;
          local_e8.a.m_string.d.ptr = (char16_t *)this_01.i;
          ProString::operator=
                    (this_01.i,
                     (QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString_&>,_const_char_(&)[2]>
                      *)&local_e8);
        }
      }
      this_01.i = this_01.i + 1;
      iVar8 = QList<ProString>::end(this_00);
    } while (this_01.i != iVar8.i);
  }
  local_88._0_8_ = (Data *)0x0;
  local_88._8_8_ = (char16_t *)0x0;
  local_88._16_8_ = 0;
  bVar6 = ProString::endsWith((ProString *)local_68,"_REMOVE",CaseSensitive);
  if (bVar6) {
    ProString::mid(&local_118,(ProString *)local_68,0,iStack_4c + -7);
    ProString::ProString(&local_e8.a,&local_118);
    local_e8.b = (char (*) [5])0x2ae118;
    QStringBuilder<ProString,_const_char_(&)[5]>::convertTo<QString>(&local_a8,&local_e8);
LAB_001a2f07:
    local_88._8_8_ = local_a8.d.ptr;
    local_88._0_8_ = local_a8.d.d;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    local_88._16_8_ = local_a8.d.size;
    local_a8.d.size = 0;
    if (&(local_e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_e8.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_118.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    bVar6 = ProString::endsWith((ProString *)local_68,"_ASSIGN",CaseSensitive);
    if (bVar6) {
      ProString::mid(&local_118,(ProString *)local_68,0,iStack_4c + -7);
      ProString::ProString(&local_e8.a,&local_118);
      local_e8.b = (char (*) [5])0x2ae8e2;
      QStringBuilder<ProString,_const_char_(&)[4]>::convertTo<QString>
                (&local_a8,(QStringBuilder<ProString,_const_char_(&)[4]> *)&local_e8);
      goto LAB_001a2f07;
    }
    local_118.m_string.d.ptr = L" += ";
    local_118.m_string.d.d = (Data *)local_68;
    QStringBuilder<const_ProKey_&,_const_char_(&)[5]>::convertTo<QString>
              ((QString *)&local_e8,(QStringBuilder<const_ProKey_&,_const_char_(&)[5]> *)&local_118)
    ;
    local_88._0_8_ = local_e8.a.m_string.d.d;
    local_88._8_8_ = local_e8.a.m_string.d.ptr;
    local_88._16_8_ = local_e8.a.m_string.d.size;
  }
  local_e8.a.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.a.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.a.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  ProStringList::join((QString *)&local_e8,(ProStringList *)this_00,(QChar)0x20);
  uVar5 = local_88._16_8_;
  if ((char *)0x50 < (char *)(local_88._16_8_ + local_e8.a.m_string.d.size)) {
    local_118.m_string.d.d = (Data *)0x0;
    local_118.m_string.d.ptr = (char16_t *)0x0;
    local_118.m_string.d.size = 0;
    if ((char *)local_88._16_8_ != (char *)0x0) {
      uVar9 = 0;
      do {
        QString::append(&local_118," ",1);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)uVar5);
    }
    local_128.a = (char (*) [4])0x2ae11d;
    local_128.b = &local_118.m_string;
    ProStringList::join<char_const(&)[4],QString&>(&local_a8,(ProStringList *)this_00,&local_128);
    qVar4 = local_a8.d.size;
    pDVar3 = local_a8.d.d;
    pcVar2 = local_e8.a.m_string.d.ptr;
    pDVar1 = local_e8.a.m_string.d.d;
    local_a8.d.d = local_e8.a.m_string.d.d;
    local_e8.a.m_string.d.d = pDVar3;
    local_e8.a.m_string.d.ptr = local_a8.d.ptr;
    local_a8.d.ptr = pcVar2;
    local_a8.d.size = local_e8.a.m_string.d.size;
    local_e8.a.m_string.d.size = qVar4;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
    if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  local_118.m_string.d.d = (Data *)local_88;
  local_118.m_string.d.size = 0x2af0f8;
  local_118.m_string.d.ptr = (char16_t *)&local_e8;
  QStringBuilder<QStringBuilder<QString_&,_QString_&>,_const_char_(&)[2]>::convertTo<QString>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<QString_&,_QString_&>,_const_char_(&)[2]> *)&local_118);
  if (&(local_e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e8.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
LAB_001a3144:
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectGenerator::getWritableVar(const char *vk, bool)
{
    const ProKey v(vk);
    ProStringList &vals = project->values(v);
    if(vals.isEmpty())
        return "";

    // If values contain spaces, ensure that they are quoted
    for (ProStringList::iterator it = vals.begin(); it != vals.end(); ++it) {
        if ((*it).contains(' ') && !(*it).startsWith(' '))
            *it = "\"" + *it + "\"";
    }

    QString ret;
    if(v.endsWith("_REMOVE"))
        ret = v.left(v.length() - 7) + " -= ";
    else if(v.endsWith("_ASSIGN"))
        ret = v.left(v.length() - 7) + " = ";
    else
        ret = v + " += ";
    QString join = vals.join(' ');
    if(ret.size() + join.size() > 80) {
        QString spaces;
        for(int i = 0; i < ret.size(); i++)
            spaces += " ";
        join = vals.join(" \\\n" + spaces);
    }
    return ret + join + "\n";
}